

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  uint32_t uVar1;
  uint32_t rlc;
  uint32_t im_00;
  int iVar2;
  HufDec *pHVar3;
  uint8_t **pcode;
  exr_const_context_t pctxt_00;
  exr_const_context_t in_RCX;
  undefined1 *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  FastHufDecoder *in_R8;
  exr_const_context_t in_R9;
  HufDec *in_stack_00000008;
  uint64_t nLeft;
  HufDec *hdec;
  uint64_t *freq;
  FastHufDecoder *fhd;
  uint64_t hufInfoBlockSize;
  exr_const_context_t pctxt;
  exr_result_t rv;
  uint8_t *ptr;
  uint64_t nBytes;
  uint32_t nBits;
  uint32_t iM;
  uint32_t im;
  uint32_t in_stack_00000738;
  uint32_t in_stack_0000073c;
  uint64_t in_stack_00000740;
  uint8_t **in_stack_00000748;
  FastHufDecoder *in_stack_00000750;
  exr_const_context_t in_stack_00000758;
  int in_stack_00000770;
  uint64_t *hcode;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffb8;
  exr_const_context_t pctxt_01;
  exr_result_t local_4;
  
  uVar4 = 0;
  hcode = (uint64_t *)0x14;
  if (in_RDI != 0) {
    uVar4 = *(undefined8 *)(in_RDI + 0x18);
  }
  if (in_RDX < (undefined1 *)0x14) {
    if (in_R8 == (FastHufDecoder *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  else {
    pHVar3 = (HufDec *)internal_exr_huf_decompress_spare_bytes();
    if (in_stack_00000008 == pHVar3) {
      uVar1 = readUInt(in_RSI);
      rlc = readUInt(in_RSI + 4);
      im_00 = readUInt(in_RSI + 0xc);
      if ((uVar1 < 0x10001) && (rlc < 0x10001)) {
        pcode = (uint8_t **)(in_RSI + 0x14);
        pHVar3 = (HufDec *)((ulong)im_00 + 7 >> 3);
        if (in_RDX < &pHVar3[1].lit) {
          local_4 = 1;
        }
        else {
          iVar2 = fasthuf_decode_enabled();
          if ((iVar2 == 0) || (im_00 < 0x81)) {
            pctxt_00 = (exr_const_context_t)(in_RDX + -0x14);
            pctxt_01 = in_R9;
            hufClearDecTable((HufDec *)0x10fe03);
            hufUnpackEncTable(pcode,(uint64_t *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (uint32_t)((ulong)uVar4 >> 0x20),(uint32_t)uVar4,hcode);
            if ((ulong)((long)pctxt_00 << 3) < (ulong)im_00) {
              local_4 = 0x17;
            }
            else {
              local_4 = hufBuildDecTable(pctxt_01,(uint64_t *)CONCAT44(uVar1,rlc),im_00,
                                         in_stack_ffffffffffffffb8,pHVar3);
              if (local_4 == 0) {
                local_4 = hufDecode((uint64_t *)in_R9,
                                    (HufDec *)&in_R9[0x3b5].first_part.chunk_table_offset,
                                    (uint8_t *)pcode,(ulong)im_00,rlc,(uint64_t)in_R8,
                                    (uint16_t *)in_RCX);
              }
              hufFreeDecTable(pctxt_00,in_stack_00000008);
            }
          }
          else {
            local_4 = fasthuf_initialize(in_stack_00000758,in_stack_00000750,in_stack_00000748,
                                         in_stack_00000740,in_stack_0000073c,in_stack_00000738,
                                         in_stack_00000770);
            if (local_4 == 0) {
              if (in_RDX < (undefined1 *)(((long)pcode - (long)in_RSI) + (long)pHVar3)) {
                local_4 = 1;
              }
              else {
                local_4 = fasthuf_decode(in_RCX,in_R8,&in_R9->mode,CONCAT44(uVar1,rlc),
                                         (uint16_t *)CONCAT44(im_00,in_stack_ffffffffffffffb8),
                                         (uint64_t)pHVar3);
              }
            }
          }
        }
      }
      else {
        local_4 = 0x17;
      }
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t            im, iM, nBits;
    uint64_t            nBytes;
    const uint8_t*      ptr;
    exr_result_t        rv;
    exr_const_context_t pctxt            = NULL;
    const uint64_t      hufInfoBlockSize = 5 * sizeof (uint32_t);

    if (decode) pctxt = decode->context;
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (
            pctxt, fhd, &ptr, nCompressed - hufInfoBlockSize, im, iM, (int) iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ((uint64_t) (ptr - compressed) + nBytes > nCompressed)
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, nRaw);
        }
    }
    else
    {
        uint64_t* freq  = (uint64_t*) spare;
        HufDec*   hdec  = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (pctxt, freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (pctxt, hdec);
    }
    return rv;
}